

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O2

block * gen_snap(compiler_state_t *cstate,bpf_u_int32 orgcode,bpf_u_int32 ptype)

{
  block *pbVar1;
  u_char snapblock [8];
  
  snapblock[3] = (u_char)(orgcode >> 0x10);
  snapblock[0] = 0xaa;
  snapblock[1] = 0xaa;
  snapblock[2] = '\x03';
  snapblock[4] = (u_char)(orgcode >> 8);
  snapblock[5] = (u_char)orgcode;
  snapblock[6] = (u_char)(ptype >> 8);
  snapblock[7] = (u_char)ptype;
  pbVar1 = gen_bcmp(cstate,OR_LLC,0,8,snapblock);
  return pbVar1;
}

Assistant:

static struct block *
gen_snap(compiler_state_t *cstate, bpf_u_int32 orgcode, bpf_u_int32 ptype)
{
	u_char snapblock[8];

	snapblock[0] = LLCSAP_SNAP;	/* DSAP = SNAP */
	snapblock[1] = LLCSAP_SNAP;	/* SSAP = SNAP */
	snapblock[2] = 0x03;		/* control = UI */
	snapblock[3] = (orgcode >> 16);	/* upper 8 bits of organization code */
	snapblock[4] = (orgcode >> 8);	/* middle 8 bits of organization code */
	snapblock[5] = (orgcode >> 0);	/* lower 8 bits of organization code */
	snapblock[6] = (ptype >> 8);	/* upper 8 bits of protocol type */
	snapblock[7] = (ptype >> 0);	/* lower 8 bits of protocol type */
	return gen_bcmp(cstate, OR_LLC, 0, 8, snapblock);
}